

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

_Bool sbs_check_type(sbs_t *sbs,uint8_t type)

{
  bool bVar1;
  bool bVar2;
  int32_t i;
  _Bool answer;
  uint8_t type_local;
  sbs_t *sbs_local;
  
  bVar1 = true;
  for (i = 0; i < (sbs->roaring->high_low_container).size; i = i + 1) {
    bVar2 = false;
    if (bVar1) {
      bVar2 = (sbs->roaring->high_low_container).typecodes[i] == type;
    }
    bVar1 = bVar2;
  }
  return bVar1;
}

Assistant:

bool sbs_check_type(sbs_t *sbs, uint8_t type) {
    bool answer = true;
    for (int32_t i = 0; i < sbs->roaring->high_low_container.size; i++) {
        answer =
            answer && (sbs->roaring->high_low_container.typecodes[i] == type);
    }
    return answer;
}